

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O2

void KeccakP1600_AddLanes(void *state,uchar *data,uint laneCount)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  while (uVar4 + 8 <= (ulong)laneCount) {
    puVar1 = (ulong *)((long)state + uVar4 * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8);
    puVar1 = (ulong *)((long)state + uVar4 * 8 + 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8 + 8);
    puVar1 = (ulong *)((long)state + uVar4 * 8 + 0x10);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8 + 0x10);
    puVar1 = (ulong *)((long)state + uVar4 * 8 + 0x18);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8 + 0x18);
    puVar1 = (ulong *)((long)state + uVar4 * 8 + 0x20);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8 + 0x20);
    puVar1 = (ulong *)((long)state + uVar4 * 8 + 0x28);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8 + 0x28);
    puVar1 = (ulong *)((long)state + uVar4 * 8 + 0x30);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8 + 0x30);
    puVar1 = (ulong *)((long)state + uVar4 * 8 + 0x38);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8 + 0x38);
    uVar4 = uVar4 + 8;
  }
  while( true ) {
    iVar2 = (int)uVar4;
    if (laneCount < iVar2 + 4U) break;
    puVar1 = (ulong *)((long)state + (uVar4 & 0xffffffff) * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + (uVar4 & 0xffffffff) * 8);
    puVar1 = (ulong *)((long)state + (ulong)(iVar2 + 1) * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + (ulong)(iVar2 + 1) * 8);
    puVar1 = (ulong *)((long)state + (ulong)(iVar2 + 2) * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + (ulong)(iVar2 + 2) * 8);
    puVar1 = (ulong *)((long)state + (ulong)(iVar2 + 3) * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + (ulong)(iVar2 + 3) * 8);
    uVar4 = (ulong)(iVar2 + 4U);
  }
  while( true ) {
    uVar3 = (uint)uVar4;
    uVar4 = uVar4 & 0xffffffff;
    if (laneCount < uVar3 + 2) break;
    puVar1 = (ulong *)((long)state + uVar4 * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8);
    puVar1 = (ulong *)((long)state + (ulong)(uVar3 + 1) * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + (ulong)(uVar3 + 1) * 8);
    uVar4 = (ulong)(uVar3 + 2);
  }
  if (uVar3 < laneCount) {
    puVar1 = (ulong *)((long)state + uVar4 * 8);
    *puVar1 = *puVar1 ^ *(ulong *)(data + uVar4 * 8);
  }
  return;
}

Assistant:

void KeccakP1600_AddLanes(void *state, const unsigned char *data, unsigned int laneCount)
{
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    unsigned int i = 0;
#ifdef NO_MISALIGNED_ACCESSES
    /* If either pointer is misaligned, fall back to byte-wise xor. */
    if (((((uintptr_t)state) & 7) != 0) || ((((uintptr_t)data) & 7) != 0)) {
      for (i = 0; i < laneCount * 8; i++) {
        ((unsigned char*)state)[i] ^= data[i];
      }
    }
    else
#endif
    {
      /* Otherwise... */
      for( ; (i+8)<=laneCount; i+=8) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
          ((uint64_t*)state)[i+1] ^= ((uint64_t*)data)[i+1];
          ((uint64_t*)state)[i+2] ^= ((uint64_t*)data)[i+2];
          ((uint64_t*)state)[i+3] ^= ((uint64_t*)data)[i+3];
          ((uint64_t*)state)[i+4] ^= ((uint64_t*)data)[i+4];
          ((uint64_t*)state)[i+5] ^= ((uint64_t*)data)[i+5];
          ((uint64_t*)state)[i+6] ^= ((uint64_t*)data)[i+6];
          ((uint64_t*)state)[i+7] ^= ((uint64_t*)data)[i+7];
      }
      for( ; (i+4)<=laneCount; i+=4) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
          ((uint64_t*)state)[i+1] ^= ((uint64_t*)data)[i+1];
          ((uint64_t*)state)[i+2] ^= ((uint64_t*)data)[i+2];
          ((uint64_t*)state)[i+3] ^= ((uint64_t*)data)[i+3];
      }
      for( ; (i+2)<=laneCount; i+=2) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
          ((uint64_t*)state)[i+1] ^= ((uint64_t*)data)[i+1];
      }
      if (i<laneCount) {
          ((uint64_t*)state)[i+0] ^= ((uint64_t*)data)[i+0];
      }
    }
#else
    unsigned int i;
    const uint8_t *curData = data;
    for(i=0; i<laneCount; i++, curData+=8) {
        uint64_t lane = (uint64_t)curData[0]
            | ((uint64_t)curData[1] <<  8)
            | ((uint64_t)curData[2] << 16)
            | ((uint64_t)curData[3] << 24)
            | ((uint64_t)curData[4] << 32)
            | ((uint64_t)curData[5] << 40)
            | ((uint64_t)curData[6] << 48)
            | ((uint64_t)curData[7] << 56);
        ((uint64_t*)state)[i] ^= lane;
    }
#endif
}